

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void cashew::ValueBuilder::appendToObjectAsSetter(Ref array,IString key,IString param,Ref value)

{
  Value *this;
  char *pcVar1;
  char cVar2;
  Ref *this_00;
  undefined8 *puVar3;
  Value *pVVar4;
  Value *pVVar5;
  Ref RVar6;
  void *pvVar7;
  Value *local_70;
  Ref array_local;
  
  local_70 = array.inst;
  array_local = value;
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&local_70);
  cVar2 = cashew::Ref::operator==(this_00,(IString *)&OBJECT);
  if (cVar2 != '\0') {
    puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_70);
    this = (Value *)*puVar3;
    pVVar4 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    pVVar4->type = Null;
    pVVar4 = Value::setArray(pVVar4,2);
    pVVar5 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    pVVar5->type = Null;
    pVVar5 = Value::setArray(pVVar5,3);
    pvVar7 = (void *)0x18;
    RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    (RVar6.inst)->type = Null;
    Value::free(RVar6.inst,pvVar7);
    (RVar6.inst)->type = String;
    pcVar1 = ___libc_start_main;
    ((RVar6.inst)->field_1).str.str._M_len = SETTER;
    ((RVar6.inst)->field_1).str.str._M_str = pcVar1;
    pVVar5 = Value::push_back(pVVar5,RVar6);
    pvVar7 = (void *)0x18;
    RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    (RVar6.inst)->type = Null;
    Value::free(RVar6.inst,pvVar7);
    (RVar6.inst)->type = String;
    ((RVar6.inst)->field_1).str.str._M_len = key.str._M_len;
    ((RVar6.inst)->field_1).str.str._M_str = key.str._M_str;
    pVVar5 = Value::push_back(pVVar5,RVar6);
    pvVar7 = (void *)0x18;
    RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    (RVar6.inst)->type = Null;
    Value::free(RVar6.inst,pvVar7);
    (RVar6.inst)->type = String;
    ((RVar6.inst)->field_1).str.str._M_len = param.str._M_len;
    ((RVar6.inst)->field_1).str.str._M_str = param.str._M_str;
    RVar6.inst = Value::push_back(pVVar5,RVar6);
    pVVar4 = Value::push_back(pVVar4,RVar6);
    RVar6.inst = Value::push_back(pVVar4,array_local);
    Value::push_back(this,RVar6);
    return;
  }
  __assert_fail("array[0] == OBJECT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x743,
                "static void cashew::ValueBuilder::appendToObjectAsSetter(Ref, IString, IString, Ref)"
               );
}

Assistant:

static void
  appendToObjectAsSetter(Ref array, IString key, IString param, Ref value) {
    assert(array[0] == OBJECT);
    array[1]->push_back(&makeRawArray(2)
                           ->push_back(&makeRawArray(3)
                                          ->push_back(makeRawString(SETTER))
                                          .push_back(makeRawString(key))
                                          .push_back(makeRawString(param)))
                           .push_back(value));
  }